

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtlp.c
# Opt level: O0

ssize_t dma_read_aligned(nettlp *nt,uintptr_t addr,void *buf,size_t count,size_t mrrs)

{
  ssize_t sVar1;
  long in_RCX;
  size_t in_RDX;
  void *in_RSI;
  uintptr_t in_RDI;
  ssize_t dma_len;
  ssize_t ret;
  size_t done;
  size_t max_len;
  size_t len;
  uintptr_t dma_addr;
  long local_60;
  nettlp *in_stack_fffffffffffffff8;
  
  local_60 = in_RCX;
  do {
    sVar1 = dma_read(in_stack_fffffffffffffff8,in_RDI,in_RSI,in_RDX);
    if (sVar1 < 0) {
      return sVar1;
    }
    local_60 = local_60 - sVar1;
  } while (0 < local_60);
  return sVar1;
}

Assistant:

ssize_t
dma_read_aligned(struct nettlp *nt, uintptr_t addr, void *buf,
		 size_t count, size_t mrrs)
{
	uintptr_t dma_addr;
	size_t len, max_len, done;
	ssize_t ret, dma_len;

	done = 0;
	dma_addr = addr;
	dma_len = count;

	do {
		max_len = 0x1000 - (dma_addr & 0xFFF);
		len = dma_len < mrrs ? dma_len : mrrs;
		len = len < max_len ? len : max_len;
		ret = dma_read(nt, dma_addr, buf + done, len);
		if (ret < 0)
			return ret;

		/* for next iteration */
		done += ret;
		dma_addr += ret;
		dma_len -= ret;

	} while (dma_len > 0);

	return ret;
}